

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk90(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  envy_bios_power_unk90_entry *peVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  uVar7 = (bios->power).unk90.offset;
  iVar10 = -0x16;
  if ((ulong)uVar7 != 0) {
    if (uVar7 < bios->length) {
      (bios->power).unk90.version = bios->data[uVar7];
    }
    else {
      (bios->power).unk90.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar1 = (bios->power).unk90.version;
    if ((uVar1 == ' ') || (uVar1 == '\x10')) {
      uVar7 = (bios->power).unk90.offset + 1;
      if (uVar7 < bios->length) {
        (bios->power).unk90.hlen = bios->data[uVar7];
        iVar10 = 0;
      }
      else {
        (bios->power).unk90.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar10 = -0xe;
      }
      uVar7 = (bios->power).unk90.offset + 2;
      if (uVar7 < bios->length) {
        (bios->power).unk90.rlen = bios->data[uVar7];
        iVar8 = 0;
      }
      else {
        (bios->power).unk90.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar8 = -0xe;
      }
      uVar7 = (bios->power).unk90.offset + 3;
      if (uVar7 < bios->length) {
        (bios->power).unk90.entriesnum = bios->data[uVar7];
        iVar4 = 0;
      }
      else {
        (bios->power).unk90.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      (bios->power).unk90.valid = (iVar8 == 0 && iVar10 == 0) && iVar4 == 0;
      bVar2 = (bios->power).unk90.entriesnum;
      peVar5 = (envy_bios_power_unk90_entry *)malloc((ulong)((uint)bVar2 * 4));
      (bios->power).unk90.entries = peVar5;
      if (bVar2 == 0) {
        iVar10 = 0;
      }
      else {
        uVar6 = (uint)(bios->power).unk90.hlen + (bios->power).unk90.offset;
        bVar3 = (bios->power).unk90.rlen;
        iVar10 = 0;
        uVar9 = 0;
        do {
          peVar5[uVar9].offset = uVar6;
          uVar9 = uVar9 + 1;
          uVar6 = uVar6 + bVar3;
        } while (bVar2 != uVar9);
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER PSI table version 0x%x\n");
    }
  }
  return iVar10;
}

Assistant:

int envy_bios_parse_power_unk90(struct envy_bios *bios) {
	struct envy_bios_power_unk90 *unk90 = &bios->power.unk90;
	int i, err = 0;

	if (!unk90->offset)
		return -EINVAL;

	bios_u8(bios, unk90->offset + 0x0, &unk90->version);
	switch(unk90->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk90->offset + 0x1, &unk90->hlen);
		err |= bios_u8(bios, unk90->offset + 0x2, &unk90->rlen);
		err |= bios_u8(bios, unk90->offset + 0x3, &unk90->entriesnum);
		unk90->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER PSI table version 0x%x\n", unk90->version);
		return -EINVAL;
	};

	err = 0;
	unk90->entries = malloc(unk90->entriesnum * sizeof(struct envy_bios_power_unk90_entry));
	for (i = 0; i < unk90->entriesnum; i++) {
		uint32_t data = unk90->offset + unk90->hlen + i * unk90->rlen;

		unk90->entries[i].offset = data;
	}

	return 0;
}